

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O3

SystemTimingCheckSyntax * __thiscall slang::parsing::Parser::parseSystemTimingCheck(Parser *this)

{
  Token closeParen_00;
  bool bVar1;
  int iVar2;
  SourceLocation SVar3;
  undefined8 uVar4;
  TimingCheckArgSyntax *pTVar5;
  undefined4 extraout_var;
  SystemTimingCheckSyntax *pSVar6;
  Info *src;
  Info *extraout_RDX;
  undefined8 extraout_RDX_00;
  TokenKind kind;
  ulong uVar7;
  Token TVar8;
  Token TVar9;
  Token TVar10;
  Token name;
  Token closeParen;
  Token openParen;
  Token local_260;
  Info *local_250;
  undefined8 local_248;
  Token local_240;
  Token local_230;
  Token local_220;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_210;
  ulong local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  Token local_1d8;
  undefined1 local_1c8 [24];
  undefined1 auStack_1b0 [24];
  __extent_storage<18446744073709551615UL> local_198;
  
  TVar8 = ParserBase::consume(&this->super_ParserBase);
  local_250 = TVar8.info;
  local_248 = TVar8._0_8_;
  Token::Token(&local_240);
  Token::Token(&local_260);
  local_240 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
  if ((local_240._0_4_ >> 0x10 & 1) != 0) {
    SVar3 = Token::location(&local_240);
    local_260 = ParserBase::missingToken(&this->super_ParserBase,CloseParenthesis,SVar3);
    local_1f0 = 0;
    local_1e8 = 0;
    goto LAB_003bb15c;
  }
  local_1c8._0_8_ = auStack_1b0;
  local_1c8._8_8_ = 0;
  local_1c8._16_8_ = (SyntaxNode *)0x10;
  TVar8 = ParserBase::peek(&this->super_ParserBase);
  local_220 = TVar8;
  bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar8.kind);
  if (bVar1) {
    bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar1) {
      SVar3 = Token::location(&local_220);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x10001,SVar3);
    }
LAB_003bafc7:
    local_260 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
    src = local_260.info;
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isPossibleTimingCheckArg(TVar8.kind);
    if (bVar1) {
      local_210._M_rest =
           (_Variadic_union<const_slang::syntax::SyntaxNode_*>)parseTimingCheckArg(this);
      local_200 = CONCAT71(local_200._1_7_,1);
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                 (TokenOrSyntax *)&local_210._M_first);
      TVar9 = ParserBase::peek(&this->super_ParserBase);
      uVar4 = TVar9._0_8_;
      bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar9.kind);
      if (TVar9.kind != EndOfFile && !bVar1) {
        do {
          if ((short)uVar4 != 0x18) {
            ParserBase::expect(&this->super_ParserBase,Comma);
            do {
              bVar1 = ParserBase::
                      skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleTimingCheckArg,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                (&this->super_ParserBase,(DiagCode)0x10001,false);
              if (!bVar1) goto LAB_003bafc7;
              bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
            } while (!bVar1);
          }
          local_210._M_first._M_storage =
               (_Uninitialized<slang::parsing::Token,_true>)
               ParserBase::expect(&this->super_ParserBase,Comma);
          local_200 = local_200 & 0xffffffffffffff00;
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                     (TokenOrSyntax *)&local_210._M_first);
          TVar9 = ParserBase::peek(&this->super_ParserBase);
          kind = TVar9.kind;
          bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(kind);
          if (kind == EndOfFile || bVar1) {
            pTVar5 = parseTimingCheckArg(this);
            local_210._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pTVar5;
            local_200 = CONCAT71(local_200._1_7_,1);
            SmallVectorBase<slang::syntax::TokenOrSyntax>::
            emplace_back<slang::syntax::TokenOrSyntax>
                      ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                       (TokenOrSyntax *)&local_210._M_first);
            break;
          }
          if ((TVar8.info == TVar9.info && TVar8.kind == kind) &&
             (bVar1 = ParserBase::
                      skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleTimingCheckArg,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                (&this->super_ParserBase,(DiagCode)0x10001,true), !bVar1)) break;
          pTVar5 = parseTimingCheckArg(this);
          local_210._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pTVar5;
          local_200 = CONCAT71(local_200._1_7_,1);
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                     (TokenOrSyntax *)&local_210._M_first);
          TVar10 = ParserBase::peek(&this->super_ParserBase);
          uVar4 = TVar10._0_8_;
          bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar10.kind);
          uVar7 = TVar9._0_8_ & 0xffffffff;
          TVar8.info = TVar9.info;
          TVar8.kind = (short)uVar7;
          TVar8._2_1_ = (char)(uVar7 >> 0x10);
          TVar8.numFlags.raw = (char)(uVar7 >> 0x18);
          TVar8.rawLen = (int)(uVar7 >> 0x20);
        } while (TVar10.kind != EndOfFile && !bVar1);
      }
      goto LAB_003bafc7;
    }
    ParserBase::reportMissingList
              (&this->super_ParserBase,TVar8,CloseParenthesis,&local_260,(DiagCode)0x10001);
    src = extraout_RDX;
  }
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)src);
  local_1e8 = CONCAT44(extraout_var,iVar2);
  local_1f0 = extraout_RDX_00;
  if ((pointer)local_1c8._0_8_ != (pointer)auStack_1b0) {
    operator_delete((void *)local_1c8._0_8_);
  }
LAB_003bb15c:
  TVar9 = local_240;
  TVar8 = local_260;
  local_1c8._8_4_ = 1;
  local_1c8._16_8_ = (SyntaxNode *)0x0;
  auStack_1b0._0_8_ = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)0x0;
  auStack_1b0._8_8_ = (Info *)0x0;
  auStack_1b0._16_8_ = (pointer)0x0;
  local_198._M_extent_value = 0;
  local_1c8._0_8_ = &PTR_getChild_005c8770;
  local_210._8_4_ = 3;
  local_200 = 0;
  uStack_1f8 = 0;
  local_210._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_005cc748;
  local_1d8.kind = local_260.kind;
  local_1d8._2_1_ = local_260._2_1_;
  local_1d8.numFlags.raw = local_260.numFlags.raw;
  local_1d8.rawLen = local_260.rawLen;
  local_1d8.info = local_260.info;
  local_260 = TVar8;
  local_1e0 = local_1f0;
  local_230 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  closeParen_00.info = local_1d8.info;
  closeParen_00.kind = local_1d8.kind;
  closeParen_00._2_1_ = local_1d8._2_1_;
  closeParen_00.numFlags.raw = local_1d8.numFlags.raw;
  closeParen_00.rawLen = local_1d8.rawLen;
  name.info = local_250;
  name.kind = (undefined2)local_248;
  name._2_1_ = local_248._2_1_;
  name.numFlags.raw = local_248._3_1_;
  name.rawLen = local_248._4_4_;
  pSVar6 = slang::syntax::SyntaxFactory::systemTimingCheck
                     (&this->factory,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_1c8
                      ,name,TVar9,
                      (SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax> *)
                      &local_210._M_first,closeParen_00,local_230);
  return pSVar6;
}

Assistant:

SystemTimingCheckSyntax& Parser::parseSystemTimingCheck() {
    auto name = consume();

    Token openParen, closeParen;
    std::span<TokenOrSyntax> list;
    parseList<isPossibleTimingCheckArg, isEndOfParenList>(
        TokenKind::OpenParenthesis, TokenKind::CloseParenthesis, TokenKind::Comma, openParen, list,
        closeParen, RequireItems::True, diag::ExpectedExpression,
        [this] { return &parseTimingCheckArg(); }, AllowEmpty::True);

    return factory.systemTimingCheck(nullptr, name, openParen, list, closeParen,
                                     expect(TokenKind::Semicolon));
}